

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void * filemgr_get_header(filemgr *file,void *buf,size_t *len,bid_t *header_bid,fdb_seqnum_t *seqnum
                         ,filemgr_header_revnum_t *header_revnum)

{
  bid_t bVar1;
  ulong __size;
  
  pthread_spin_lock(&file->lock);
  __size = (ulong)(file->header).size;
  if (__size != 0) {
    if (buf == (void *)0x0) {
      buf = malloc(__size);
    }
    memcpy(buf,(file->header).data,__size);
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)(file->header).size;
  }
  if (header_bid != (bid_t *)0x0) {
    if ((file->header).size == 0) {
      bVar1 = 0xffffffffffffffff;
    }
    else {
      bVar1 = (file->header).bid.super___atomic_base<unsigned_long>._M_i;
    }
    *header_bid = bVar1;
  }
  if (seqnum != (fdb_seqnum_t *)0x0) {
    *seqnum = (file->header).seqnum.super___atomic_base<unsigned_long>._M_i;
  }
  if (header_revnum != (filemgr_header_revnum_t *)0x0) {
    *header_revnum = (file->header).revnum;
  }
  pthread_spin_unlock(&file->lock);
  return buf;
}

Assistant:

void* filemgr_get_header(struct filemgr *file, void *buf, size_t *len,
                         bid_t *header_bid, fdb_seqnum_t *seqnum,
                         filemgr_header_revnum_t *header_revnum)
{
    spin_lock(&file->lock);

    if (file->header.size > 0) {
        if (buf == NULL) {
            buf = (void*)malloc(file->header.size);
        }
        memcpy(buf, file->header.data, file->header.size);
    }

    if (len) {
        *len = file->header.size;
    }
    if (header_bid) {
        *header_bid = filemgr_get_header_bid(file);
    }
    if (seqnum) {
        *seqnum = file->header.seqnum;
    }
    if (header_revnum) {
        *header_revnum = file->header.revnum;
    }

    spin_unlock(&file->lock);

    return buf;
}